

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O3

bool __thiscall
tinyusdz::InheritPrimSpec(tinyusdz *this,PrimSpec *dst,PrimSpec *src,string *warn,string *err)

{
  _Rb_tree_node_base *__k;
  PrimSpec *pPVar1;
  PrimSpec *dst_00;
  PrimSpec *pPVar2;
  bool bVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  long lVar8;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  __it;
  PrimSpec *child;
  __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
  src_00;
  PrimSpec *pPVar9;
  PrimSpec ps;
  undefined1 local_598 [40];
  string local_570 [32];
  PrimSpec *local_550;
  PrimSpec *local_548;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  local_538 [8];
  _Rb_tree_node_base local_530 [6];
  PrimMetas local_460;
  
  PrimSpec::PrimSpec((PrimSpec *)local_598,dst);
  ::std::__cxx11::string::_M_assign(local_570);
  if (*(long *)(this + 0x10) != 0) {
    ::std::__cxx11::string::_M_assign((string *)(local_598 + 8));
  }
  local_598._0_4_ = *(undefined4 *)this;
  PrimMetas::update_from(&local_460,(PrimMetas *)(this + 0x138),true);
  p_Var6 = *(_Rb_tree_node_base **)(this + 0x78);
  pPVar2 = local_548;
  while (dst_00 = local_550, p_Var6 != (_Rb_tree_node_base *)(this + 0x68)) {
    __k = p_Var6 + 1;
    local_548 = pPVar2;
    cVar4 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::find(local_538,(key_type *)__k);
    if (cVar4._M_node == local_530) {
      pmVar5 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                             *)local_538,(key_type *)__k);
    }
    else {
      pmVar5 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)local_538,(key_type *)__k);
    }
    ::std::__cxx11::string::_M_assign((string *)pmVar5);
    (pmVar5->_attrib)._varying_authored = (bool)p_Var6[3].field_0x4;
    (pmVar5->_attrib)._variability = p_Var6[3]._M_color;
    ::std::__cxx11::string::_M_assign((string *)&(pmVar5->_attrib)._type_name);
    linb::any::operator=((any *)&(pmVar5->_attrib)._var,(any *)&p_Var6[4]._M_parent);
    (pmVar5->_attrib)._var._blocked = SUB41(p_Var6[5]._M_color,0);
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::operator=(&(pmVar5->_attrib)._var._ts._samples,
                (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)&p_Var6[5]._M_parent);
    (pmVar5->_attrib)._var._ts._dirty = SUB41(p_Var6[6]._M_color,0);
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&(pmVar5->_attrib)._paths,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var6[6]._M_parent);
    AttrMetas::operator=(&(pmVar5->_attrib)._metas,(AttrMetas *)(p_Var6 + 7));
    *(_Base_ptr *)&pmVar5->_listOpQual = p_Var6[0x17]._M_parent;
    (pmVar5->_rel).type = *(Type *)&p_Var6[0x17]._M_left;
    Path::operator=(&(pmVar5->_rel).targetPath,(Path *)&p_Var6[0x17]._M_right);
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&(pmVar5->_rel).targetPathVector,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var6[0x1e]._M_parent);
    (pmVar5->_rel).listOpQual = p_Var6[0x1f]._M_color;
    AttrMetas::operator=(&(pmVar5->_rel)._metas,(AttrMetas *)&p_Var6[0x1f]._M_parent);
    (pmVar5->_rel)._varying_authored = *(bool *)&p_Var6[0x2f]._M_left;
    ::std::__cxx11::string::_M_assign((string *)&pmVar5->_prop_value_type_name);
    pmVar5->_has_custom = *(bool *)&p_Var6[0x30]._M_right;
    p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6);
    pPVar2 = local_548;
  }
  do {
    if (dst_00 == pPVar2) {
      bVar3 = true;
      if ((tinyusdz *)local_598 != this) {
        PrimSpec::MoveFrom((PrimSpec *)this,(PrimSpec *)local_598);
      }
LAB_001b2706:
      PrimSpec::~PrimSpec((PrimSpec *)local_598);
      return bVar3;
    }
    __it._M_current = *(PrimSpec **)(this + 0x48);
    pPVar1 = *(PrimSpec **)(this + 0x50);
    lVar7 = (long)pPVar1 - (long)__it._M_current;
    lVar8 = (lVar7 >> 3) * -0x77dc7c4cf2ae9cdb >> 2;
    if (0 < lVar8) {
      pPVar9 = __it._M_current + lVar8 * 4;
      lVar8 = lVar8 + 1;
      do {
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                ::operator()((_Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                              *)dst_00,__it);
        src_00._M_current = __it._M_current;
        if (bVar3) goto LAB_001b26b6;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                ::operator()((_Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                              *)dst_00,__it._M_current + 1);
        src_00._M_current = __it._M_current + 1;
        if (bVar3) goto LAB_001b26b6;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                ::operator()((_Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                              *)dst_00,__it._M_current + 2);
        src_00._M_current = __it._M_current + 2;
        if (bVar3) goto LAB_001b26b6;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                ::operator()((_Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                              *)dst_00,__it._M_current + 3);
        src_00._M_current = __it._M_current + 3;
        if (bVar3) goto LAB_001b26b6;
        __it._M_current = __it._M_current + 4;
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
      lVar7 = (long)pPVar1 - (long)pPVar9;
      __it._M_current = pPVar9;
    }
    lVar7 = (lVar7 >> 3) * -0x77dc7c4cf2ae9cdb;
    if (lVar7 == 1) {
LAB_001b269d:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
              ::operator()((_Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                            *)dst_00,__it);
      src_00._M_current = __it._M_current;
      if (!bVar3) {
        src_00._M_current = pPVar1;
      }
LAB_001b26b6:
      if ((src_00._M_current != pPVar1) &&
         (bVar3 = detail::OverridePrimSpecRec(1,dst_00,src_00._M_current,warn,err), !bVar3)) {
        bVar3 = false;
        goto LAB_001b2706;
      }
    }
    else {
      if (lVar7 == 2) {
LAB_001b2687:
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                ::operator()((_Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                              *)dst_00,__it);
        src_00._M_current = __it._M_current;
        if (!bVar3) {
          __it._M_current = __it._M_current + 1;
          goto LAB_001b269d;
        }
        goto LAB_001b26b6;
      }
      if (lVar7 == 3) {
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::$_0>
                ::operator()((_Iter_pred<tinyusdz::detail::InheritPrimSpecImpl(tinyusdz::PrimSpec&,tinyusdz::PrimSpec_const&,std::__cxx11::string*,std::__cxx11::string*)::__0>
                              *)dst_00,__it);
        src_00._M_current = __it._M_current;
        if (!bVar3) {
          __it._M_current = __it._M_current + 1;
          goto LAB_001b2687;
        }
        goto LAB_001b26b6;
      }
    }
    dst_00 = dst_00 + 1;
  } while( true );
}

Assistant:

bool InheritPrimSpec(PrimSpec &dst, const PrimSpec &src, std::string *warn,
                     std::string *err) {
  return detail::InheritPrimSpecImpl(dst, src, warn, err);
}